

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O2

tnt_error tnt_io_setopts(tnt_stream_net *s)

{
  int iVar1;
  int *piVar2;
  undefined1 local_14 [8];
  int opt;
  
  if ((((s->opt).uri)->host_hint == 3) || (iVar1 = setsockopt(s->fd,6,1,local_14,4), iVar1 != -1)) {
    tnt_io_xbufmax(s,7,(s->opt).send_buf);
    tnt_io_xbufmax(s,8,(s->opt).recv_buf);
    iVar1 = setsockopt(s->fd,1,0x15,&(s->opt).tmout_send,0x10);
    if ((iVar1 != -1) && (iVar1 = setsockopt(s->fd,1,0x14,&(s->opt).tmout_recv,0x10), iVar1 != -1))
    {
      return TNT_EOK;
    }
  }
  piVar2 = __errno_location();
  s->errno_ = *piVar2;
  return TNT_ESYSTEM;
}

Assistant:

static enum tnt_error tnt_io_setopts(struct tnt_stream_net *s) {
	int opt = 1;
	if (s->opt.uri->host_hint != URI_UNIX) {
		if (setsockopt(s->fd, IPPROTO_TCP, TCP_NODELAY, &opt, sizeof(opt)) == -1)
			goto error;
	}

	tnt_io_xbufmax(s, SO_SNDBUF, s->opt.send_buf);
	tnt_io_xbufmax(s, SO_RCVBUF, s->opt.recv_buf);

	if (setsockopt(s->fd, SOL_SOCKET, SO_SNDTIMEO,
		       &s->opt.tmout_send, sizeof(s->opt.tmout_send)) == -1)
		goto error;
	if (setsockopt(s->fd, SOL_SOCKET, SO_RCVTIMEO,
		       &s->opt.tmout_recv, sizeof(s->opt.tmout_recv)) == -1)
		goto error;
	return TNT_EOK;
error:
	s->errno_ = errno;
	return TNT_ESYSTEM;
}